

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_segment_tree.cpp
# Opt level: O2

void __thiscall
duckdb::WindowSegmentTreeState::Finalize
          (WindowSegmentTreeState *this,WindowAggregatorGlobalState *gastate,
          CollectionPtr collection)

{
  mutex *this_00;
  __pthread_list_t *p_Var1;
  ulong uVar2;
  __int_type _Var3;
  __pthread_internal_list *__n;
  value_type vVar4;
  WindowCollection *pWVar5;
  ArenaAllocator *allocator;
  const_reference pvVar6;
  vector<std::atomic<unsigned_long>,_std::allocator<std::atomic<unsigned_long>_>_> *pvVar7;
  reference pvVar8;
  ulong end;
  idx_t iVar9;
  ulong uVar10;
  templated_unique_single_t cursor;
  unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_> local_258;
  atomic<unsigned_long> *local_250;
  __pthread_internal_list **local_248;
  idx_t local_240;
  duration<long,_std::ratio<1L,_1000L>_> local_238;
  CollectionPtr collection_local;
  WindowSegmentTreePart gtstate;
  
  collection_local = collection;
  WindowAggregatorLocalState::Finalize(&this->super_WindowAggregatorLocalState,gastate,collection);
  pWVar5 = optional_ptr<duckdb::WindowCollection,_true>::operator*(&collection_local);
  make_uniq<duckdb::WindowCursor,duckdb::WindowCollection&,duckdb::vector<unsigned_long,true>const&>
            ((duckdb *)&cursor,pWVar5,&gastate->aggregator->child_idx);
  pWVar5 = optional_ptr<duckdb::WindowCollection,_true>::operator->(&collection_local);
  local_240 = pWVar5->count;
  allocator = WindowSegmentTreeGlobalState::CreateTreeAllocator
                        ((WindowSegmentTreeGlobalState *)gastate);
  local_258._M_t.
  super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>.
  super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl =
       (__uniq_ptr_data<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true,_true>
       )(__uniq_ptr_data<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true,_true>
         )cursor.super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>.
          _M_t.
          super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>
          .super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl;
  cursor.super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
  super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>.
  super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl =
       (unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>)
       (__uniq_ptr_data<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true,_true>
       )0x0;
  WindowSegmentTreePart::WindowSegmentTreePart
            (&gtstate,allocator,&gastate->aggr,
             (unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true> *)
             &local_258,&gastate->filter_mask);
  ::std::unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>::~unique_ptr
            (&local_258);
  this_00 = &gastate[1].lock;
  local_248 = &gastate[1].lock.super___mutex_base._M_mutex.__data.__list.__next;
  local_250 = &gastate[1].locals;
  while (__n = *(__pthread_internal_list **)
                ((long)&gastate[1].lock.super___mutex_base._M_mutex + 0x18),
        __n < (__pthread_internal_list *)
              (*(long *)((long)&gastate[1].lock.super___mutex_base._M_mutex + 8) -
               gastate[1].lock.super___mutex_base._M_mutex.__align >> 3)) {
    iVar9 = local_240;
    if (__n != (__pthread_internal_list *)0x0) {
      pvVar6 = vector<unsigned_long,_true>::get<true>
                         ((vector<unsigned_long,_true> *)this_00,(size_type)__n);
      vVar4 = *pvVar6;
      pvVar6 = vector<unsigned_long,_true>::get<true>
                         ((vector<unsigned_long,_true> *)this_00,
                          (size_type)((long)&__n[-1].__next + 7));
      iVar9 = vVar4 - *pvVar6;
    }
    if (iVar9 < 2) break;
    pvVar7 = &unique_ptr<duckdb::vector<std::atomic<unsigned_long>,_true>,_std::default_delete<duckdb::vector<std::atomic<unsigned_long>,_true>_>,_true>
              ::operator*((unique_ptr<duckdb::vector<std::atomic<unsigned_long>,_true>,_std::default_delete<duckdb::vector<std::atomic<unsigned_long>,_true>_>,_true>
                           *)local_248)->
              super_vector<std::atomic<unsigned_long>,_std::allocator<std::atomic<unsigned_long>_>_>
    ;
    pvVar8 = ::std::vector<std::atomic<unsigned_long>,_std::allocator<std::atomic<unsigned_long>_>_>
             ::at(pvVar7,(size_type)__n);
    uVar10 = iVar9 + 0xf >> 4;
    LOCK();
    uVar2 = (pvVar8->super___atomic_base<unsigned_long>)._M_i;
    (pvVar8->super___atomic_base<unsigned_long>)._M_i =
         (pvVar8->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
    if (uVar2 < uVar10) {
      pvVar6 = vector<unsigned_long,_true>::get<true>
                         ((vector<unsigned_long,_true> *)this_00,(size_type)__n);
      end = uVar2 * 0x10 + 0x10;
      if (iVar9 < end) {
        end = iVar9;
      }
      WindowSegmentTreePart::WindowSegmentValue
                (&gtstate,(WindowSegmentTreeGlobalState *)gastate,(idx_t)__n,uVar2 * 0x10,end,
                 (data_ptr_t)
                 ((long)&((gastate[1].aggr.filter)->super_BaseExpression)._vptr_BaseExpression +
                 (uVar2 + *pvVar6) * (long)gastate[1].aggr.function.serialize));
      WindowSegmentTreePart::FlushStates(&gtstate,__n != (__pthread_internal_list *)0x0);
      pvVar7 = &unique_ptr<duckdb::vector<std::atomic<unsigned_long>,_true>,_std::default_delete<duckdb::vector<std::atomic<unsigned_long>,_true>_>,_true>
                ::operator*((unique_ptr<duckdb::vector<std::atomic<unsigned_long>,_true>,_std::default_delete<duckdb::vector<std::atomic<unsigned_long>,_true>_>,_true>
                             *)local_250)->
                super_vector<std::atomic<unsigned_long>,_std::allocator<std::atomic<unsigned_long>_>_>
      ;
      pvVar8 = ::std::
               vector<std::atomic<unsigned_long>,_std::allocator<std::atomic<unsigned_long>_>_>::at
                         (pvVar7,(size_type)__n);
      LOCK();
      _Var3 = (pvVar8->super___atomic_base<unsigned_long>)._M_i;
      (pvVar8->super___atomic_base<unsigned_long>)._M_i =
           (pvVar8->super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
      if (_Var3 + 1 == uVar10) {
        LOCK();
        p_Var1 = &gastate[1].lock.super___mutex_base._M_mutex.__data.__list;
        p_Var1->__prev = (__pthread_internal_list *)((long)&p_Var1->__prev->__prev + 1);
        UNLOCK();
      }
    }
    else {
      while (__n == gastate[1].lock.super___mutex_base._M_mutex.__data.__list.__prev) {
        local_238.__r = 1;
        ::std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_238);
      }
    }
  }
  WindowSegmentTreePart::~WindowSegmentTreePart(&gtstate);
  ::std::unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>::~unique_ptr
            (&cursor.
              super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>);
  return;
}

Assistant:

void WindowSegmentTreeState::Finalize(WindowAggregatorGlobalState &gastate, CollectionPtr collection) {
	WindowAggregatorLocalState::Finalize(gastate, collection);

	//	Single part for constructing the tree
	auto &gstate = gastate.Cast<WindowSegmentTreeGlobalState>();
	auto cursor = make_uniq<WindowCursor>(*collection, gastate.aggregator.child_idx);
	const auto leaf_count = collection->size();
	auto &filter_mask = gstate.filter_mask;
	WindowSegmentTreePart gtstate(gstate.CreateTreeAllocator(), gastate.aggr, std::move(cursor), filter_mask);

	auto &levels_flat_native = gstate.levels_flat_native;
	const auto &levels_flat_start = gstate.levels_flat_start;
	// iterate over the levels of the segment tree
	for (;;) {
		const idx_t level_current = gstate.build_level.load();
		if (level_current >= levels_flat_start.size()) {
			break;
		}

		// level 0 is data itself
		const auto level_size =
		    (level_current == 0 ? leaf_count : levels_flat_start[level_current] - levels_flat_start[level_current - 1]);
		if (level_size <= 1) {
			break;
		}
		const idx_t build_count = (level_size + gstate.TREE_FANOUT - 1) / gstate.TREE_FANOUT;

		// Build the next fan-in
		const idx_t build_idx = (*gstate.build_started).at(level_current)++;
		if (build_idx >= build_count) {
			//	Nothing left at this level, so wait until other threads are done.
			//	Since we are only building TREE_FANOUT values at a time, this will be quick.
			while (level_current == gstate.build_level.load()) {
				std::this_thread::sleep_for(std::chrono::milliseconds(1));
			}
			continue;
		}

		// compute the aggregate for this entry in the segment tree
		const idx_t pos = build_idx * gstate.TREE_FANOUT;
		const idx_t levels_flat_offset = levels_flat_start[level_current] + build_idx;
		auto state_ptr = levels_flat_native.GetStatePtr(levels_flat_offset);
		gtstate.WindowSegmentValue(gstate, level_current, pos, MinValue(level_size, pos + gstate.TREE_FANOUT),
		                           state_ptr);
		gtstate.FlushStates(level_current > 0);

		//	If that was the last one, mark the level as complete.
		const idx_t build_complete = ++(*gstate.build_completed).at(level_current);
		if (build_complete == build_count) {
			gstate.build_level++;
			continue;
		}
	}
}